

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O1

void __thiscall HashUtil_Sha256ByteData256_Test::TestBody(HashUtil_Sha256ByteData256_Test *this)

{
  undefined **ppuVar1;
  bool bVar2;
  HashUtil *this_00;
  char *pcVar3;
  AssertionResult gtest_ar;
  ByteData byte_data2;
  ByteData256 target;
  ByteData256 byte_data;
  undefined1 local_b0 [40];
  AssertHelper local_88;
  string local_80;
  ByteData local_60;
  ByteData256 local_48;
  ByteData256 local_30;
  
  ppuVar1 = (undefined **)(local_b0 + 0x10);
  local_b0._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"1234567890123456789012345678901234567890123456789012345678901234",
             "");
  cfd::core::ByteData256::ByteData256(&local_48,(string *)local_b0);
  if ((undefined **)local_b0._0_8_ != ppuVar1) {
    operator_delete((void *)local_b0._0_8_);
  }
  cfd::core::HashUtil::Sha256(&local_30,&local_48);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_b0,&local_30);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_80,"byte_data.GetHex().c_str()",
             "\"ca1194a558362b5fa6e7887da7b41ec6faeb01c9477a0afd46dfc0692be33482\"",
             (char *)local_b0._0_8_,
             "ca1194a558362b5fa6e7887da7b41ec6faeb01c9477a0afd46dfc0692be33482");
  if ((undefined **)local_b0._0_8_ != ppuVar1) {
    operator_delete((void *)local_b0._0_8_);
  }
  if ((char)local_80._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_b0);
    if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_80._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_hashutil.cpp"
               ,0xbd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((undefined **)local_b0._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_b0._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_b0._0_8_ + 8))();
      }
      local_b0._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Sha256","");
  cfd::core::HashUtil::HashUtil((HashUtil *)local_b0,&local_80);
  this_00 = cfd::core::HashUtil::operator<<((HashUtil *)local_b0,&local_48);
  cfd::core::HashUtil::Output(&local_60,this_00);
  local_b0._0_8_ = &PTR__HashUtil_00690568;
  if ((void *)local_b0._16_8_ != (void *)0x0) {
    operator_delete((void *)local_b0._16_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_b0,&local_60);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_80,"byte_data2.GetHex().c_str()",
             "\"ca1194a558362b5fa6e7887da7b41ec6faeb01c9477a0afd46dfc0692be33482\"",
             (char *)local_b0._0_8_,
             "ca1194a558362b5fa6e7887da7b41ec6faeb01c9477a0afd46dfc0692be33482");
  if ((undefined **)local_b0._0_8_ != ppuVar1) {
    operator_delete((void *)local_b0._0_8_);
  }
  if ((char)local_80._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_b0);
    if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_80._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_hashutil.cpp"
               ,0xc2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((undefined **)local_b0._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_b0._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_b0._0_8_ + 8))();
      }
      local_b0._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HashUtil, Sha256BytePubkey) {
  Pubkey target(
      "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
  ByteData256 byte_data = HashUtil::Sha256(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "2213d0c45bf1ece1a9b0c2d5a21d603601e88e22ae2786fe3f0060ee4aad321d");
}